

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_egads.c
# Opt level: O0

REF_STATUS ref_egads_close(REF_GEOM ref_geom)

{
  REF_GEOM ref_geom_local;
  
  ref_geom->context = (void *)0x0;
  ref_geom->body = (void *)0x0;
  ref_geom->faces = (void *)0x0;
  ref_geom->edges = (void *)0x0;
  ref_geom->nodes = (void *)0x0;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_egads_close(REF_GEOM ref_geom) {
#ifdef HAVE_EGADS
  if (NULL != ref_geom->faces) EG_free((ego *)(ref_geom->faces));
  if (NULL != ref_geom->edges) EG_free((ego *)(ref_geom->edges));
  if (NULL != ref_geom->nodes) EG_free((ego *)(ref_geom->nodes));
  if (NULL != ref_geom->pcurves) ref_free((ego *)(ref_geom->pcurves));
  if (NULL != ref_geom->context)
    REIS(EGADS_SUCCESS, EG_close((ego)(ref_geom->context)), "EG close");
#endif

  ref_geom->context = NULL;
  ref_geom->body = NULL;
  ref_geom->faces = NULL;
  ref_geom->edges = NULL;
  ref_geom->nodes = NULL;

  return REF_SUCCESS;
}